

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::IsRightFaceVisited
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *this,
          CornerIndex corner_id)

{
  bool bVar1;
  CornerIndex CVar2;
  undefined4 in_ESI;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  CornerIndex opp_corner_id;
  CornerIndex next_corner_id;
  CornerTable *in_stack_ffffffffffffffc8;
  CornerTable *this_00;
  undefined4 in_stack_ffffffffffffffd8;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> in_stack_ffffffffffffffdc;
  CornerIndex in_stack_ffffffffffffffe0;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_1c;
  vector<bool,_std::allocator<bool>_> *this_01;
  const_reference local_1;
  
  this_01 = in_RDI;
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x198be0);
  CVar2 = CornerTable::Next((CornerTable *)
                            CONCAT44(in_stack_ffffffffffffffdc.value_,in_stack_ffffffffffffffd8),
                            in_stack_ffffffffffffffe0);
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x198c06);
  local_1c.value_ = (uint)CornerTable::Opposite(in_stack_ffffffffffffffc8,(uint)in_RDI);
  bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                    (&local_1c,
                     (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)&kInvalidCornerIndex);
  if (bVar1) {
    this_00 = (CornerTable *)
              &in_RDI[1].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_finish;
    std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
              ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x198c4e)
    ;
    CornerTable::Face(this_00,(CornerIndex)(uint)in_RDI);
    IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value
              ((IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *)&stack0xffffffffffffffdc);
    local_1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (this_01,CONCAT44(CVar2.value_,in_ESI));
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::IsRightFaceVisited(
    CornerIndex corner_id) const {
  const CornerIndex next_corner_id = corner_table_->Next(corner_id);
  const CornerIndex opp_corner_id = corner_table_->Opposite(next_corner_id);
  if (opp_corner_id != kInvalidCornerIndex) {
    return visited_faces_[corner_table_->Face(opp_corner_id).value()];
  }
  // Else we are on a boundary.
  return true;
}